

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void __thiscall TestSuite::TestSuite(TestSuite *this,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  rep rVar3;
  int iVar4;
  char *pcVar5;
  
  (this->options).printTestMessage = false;
  (this->options).abortOnFailure = false;
  (this->options).preserveTestFiles = false;
  this->cntPass = 0;
  this->cntFail = 0;
  (this->filter)._M_dataplus._M_p = (pointer)&(this->filter).field_2;
  (this->filter)._M_string_length = 0;
  (this->filter).field_2._M_local_buf[0] = '\0';
  this->displayMsg = false;
  this->useGivenRange = false;
  this->preserveTestFiles = false;
  this->forceAbortOnFailure = false;
  this->suppressMsg = false;
  this->givenRange = 0;
  (this->startTimeLocal).__d.__r = 0;
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->startTimeGlobal).__d.__r = rVar3;
  iVar4 = 1;
  do {
    if (argc <= iVar4) {
      return;
    }
    if (iVar4 < argc + -1) {
      pcVar5 = argv[iVar4];
      if (((*pcVar5 != '-') || (pcVar5[1] != 'f')) || (pcVar5[2] != '\0')) {
        iVar1 = strcmp(pcVar5,"--filter");
        if (iVar1 != 0) goto LAB_00104f66;
      }
      std::__cxx11::string::assign((char *)&this->filter);
      iVar4 = iVar4 + 1;
    }
LAB_00104f66:
    pcVar5 = argv[iVar4];
    iVar1 = iVar4;
    if (iVar4 < argc + -1) {
      if (((*pcVar5 != '-') || (pcVar5[1] != 'r')) || (pcVar5[2] != '\0')) {
        iVar2 = strcmp(pcVar5,"--range");
        if (iVar2 != 0) goto LAB_00104fbc;
      }
      iVar1 = iVar4 + 1;
      pcVar5 = argv[(long)iVar4 + 1];
      iVar4 = atoi(pcVar5);
      this->givenRange = (long)iVar4;
      this->useGivenRange = true;
    }
LAB_00104fbc:
    if (((*pcVar5 == '-') && (pcVar5[1] == 'p')) && (pcVar5[2] == '\0')) {
LAB_00104fe4:
      this->preserveTestFiles = true;
    }
    else {
      iVar4 = strcmp(pcVar5,"--preserve");
      if (iVar4 == 0) goto LAB_00104fe4;
    }
    iVar4 = strcmp(pcVar5,"--abort-on-failure");
    if (iVar4 == 0) {
      this->forceAbortOnFailure = true;
    }
    iVar4 = strcmp(pcVar5,"--suppress-msg");
    if (iVar4 == 0) {
      this->suppressMsg = true;
    }
    iVar4 = strcmp(pcVar5,"--display-msg");
    if ((iVar4 == 0) && (this->suppressMsg == false)) {
      this->displayMsg = true;
    }
    if (((*pcVar5 == '-') && (pcVar5[1] == 'h')) && (pcVar5[2] == '\0')) break;
    iVar2 = strcmp(pcVar5,"--help");
    iVar4 = iVar1 + 1;
  } while (iVar2 != 0);
  usage(argc,argv);
  exit(0);
}

Assistant:

TestSuite(int argc = 0, char **argv = nullptr)
        : cntPass(0)
        , cntFail(0)
        , useGivenRange(false)
        , preserveTestFiles(false)
        , forceAbortOnFailure(false)
        , suppressMsg(false)
        , displayMsg(false)
        , givenRange(0)
        , startTimeGlobal(std::chrono::system_clock::now())
    {
        for (int ii=1; ii<argc; ++ii) {
            // Filter.
            if ( ii < argc-1 &&
                 (!strcmp(argv[ii], "-f") ||
                  !strcmp(argv[ii], "--filter")) ) {
                filter = argv[++ii];
            }

            // Range.
            if ( ii < argc-1 &&
                 (!strcmp(argv[ii], "-r") ||
                  !strcmp(argv[ii], "--range")) ) {
                givenRange = atoi(argv[++ii]);
                useGivenRange = true;
            }

            // Do not clean up test files after test.
            if ( !strcmp(argv[ii], "-p") ||
                 !strcmp(argv[ii], "--preserve") ) {
                preserveTestFiles = true;
            }

            // Force abort on failure.
            if ( !strcmp(argv[ii], "--abort-on-failure") ) {
                forceAbortOnFailure = true;
            }

            // Suppress test messages.
            if ( !strcmp(argv[ii], "--suppress-msg") ) {
                suppressMsg = true;
            }

            // Display test messages.
            if ( !strcmp(argv[ii], "--display-msg") && !suppressMsg ) {
                displayMsg = true;
            }

            // Help
            if ( !strcmp(argv[ii], "-h") ||
                 !strcmp(argv[ii], "--help") ) {
                usage(argc, argv);
                exit(0);
            }
        }
    }